

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.hpp
# Opt level: O2

char * __thiscall boost::filesystem::filesystem_error::what(filesystem_error *this)

{
  shared_ptr<boost::filesystem::filesystem_error::m_imp> *this_00;
  type pmVar1;
  char *pcVar2;
  
  if ((this->m_imp_ptr).px != (element_type *)0x0) {
    this_00 = &this->m_imp_ptr;
    pmVar1 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->(this_00);
    if ((pmVar1->m_what)._M_string_length == 0) {
      system::system_error::what(&this->super_system_error);
      pmVar1 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->(this_00);
      std::__cxx11::string::assign((char *)&pmVar1->m_what);
      pmVar1 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->(this_00);
      if ((pmVar1->m_path1).m_pathname._M_string_length != 0) {
        pmVar1 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->(this_00);
        std::__cxx11::string::append((char *)&pmVar1->m_what);
        shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->(this_00);
        pmVar1 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->(this_00);
        std::__cxx11::string::append((string *)&pmVar1->m_what);
        pmVar1 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->(this_00);
        std::__cxx11::string::append((char *)&pmVar1->m_what);
      }
      pmVar1 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->(this_00);
      if ((pmVar1->m_path2).m_pathname._M_string_length != 0) {
        pmVar1 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->(this_00);
        std::__cxx11::string::append((char *)&pmVar1->m_what);
        shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->(this_00);
        pmVar1 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->(this_00);
        std::__cxx11::string::append((string *)&pmVar1->m_what);
        pmVar1 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->(this_00);
        std::__cxx11::string::append((char *)&pmVar1->m_what);
      }
    }
    pmVar1 = shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->(this_00);
    return (pmVar1->m_what)._M_dataplus._M_p;
  }
  pcVar2 = system::system_error::what(&this->super_system_error);
  return pcVar2;
}

Assistant:

const char* what() const BOOST_NOEXCEPT_OR_NOTHROW
      {
        if (!m_imp_ptr.get())
        return system::system_error::what();

        try
        {
          if (m_imp_ptr->m_what.empty())
          {
            m_imp_ptr->m_what = system::system_error::what();
            if (!m_imp_ptr->m_path1.empty())
            {
              m_imp_ptr->m_what += ": \"";
              m_imp_ptr->m_what += m_imp_ptr->m_path1.string();
              m_imp_ptr->m_what += "\"";
            }
            if (!m_imp_ptr->m_path2.empty())
            {
              m_imp_ptr->m_what += ", \"";
              m_imp_ptr->m_what += m_imp_ptr->m_path2.string();
              m_imp_ptr->m_what += "\"";
            }
          }
          return m_imp_ptr->m_what.c_str();
        }
        catch (...)
        {
          return system::system_error::what();
        }
      }